

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CategoricalCrossEntropyLossLayer * __thiscall
CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer(LossLayer *this)

{
  bool bVar1;
  CategoricalCrossEntropyLossLayer *this_00;
  LossLayer *this_local;
  
  bVar1 = has_categoricalcrossentropylosslayer(this);
  if (!bVar1) {
    clear_LossLayerType(this);
    set_has_categoricalcrossentropylosslayer(this);
    this_00 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer(this_00);
    (this->LossLayerType_).categoricalcrossentropylosslayer_ = this_00;
  }
  return (this->LossLayerType_).categoricalcrossentropylosslayer_;
}

Assistant:

inline ::CoreML::Specification::CategoricalCrossEntropyLossLayer* LossLayer::mutable_categoricalcrossentropylosslayer() {
  if (!has_categoricalcrossentropylosslayer()) {
    clear_LossLayerType();
    set_has_categoricalcrossentropylosslayer();
    LossLayerType_.categoricalcrossentropylosslayer_ = new ::CoreML::Specification::CategoricalCrossEntropyLossLayer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LossLayer.categoricalCrossEntropyLossLayer)
  return LossLayerType_.categoricalcrossentropylosslayer_;
}